

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O0

void __thiscall
helics::BrokerBase::BrokerBase(BrokerBase *this,string_view broker_name,bool DisableQueue)

{
  int iVar1;
  byte in_CL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined4 in_stack_ffffffffffffff68;
  __integral_type_conflict in_stack_ffffffffffffff6c;
  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
  *in_stack_ffffffffffffff70;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  allocator<char> local_21;
  undefined4 local_20;
  byte local_19;
  
  local_19 = in_CL & 1;
  (in_RDI->_M_dataplus)._M_p = (pointer)&PTR__BrokerBase_00a50c08;
  local_20 = 0;
  CLI::std::atomic<helics::GlobalBrokerId>::atomic
            ((atomic<helics::GlobalBrokerId> *)&in_RDI->_M_string_length,(GlobalBrokerId)0x0);
  *(undefined4 *)((long)&in_RDI->_M_string_length + 4) = 0;
  GlobalBrokerId::GlobalBrokerId((GlobalBrokerId *)((long)&in_RDI->_M_string_length + 4));
  GlobalBrokerId::GlobalBrokerId((GlobalBrokerId *)&in_RDI->field_2,0);
  std::atomic<int>::atomic((atomic<int> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c);
  *(undefined4 *)((long)&in_RDI->field_2 + 8) = 1;
  *(undefined4 *)((long)&in_RDI->field_2 + 0xc) = 0;
  iVar1 = std::numeric_limits<int>::max();
  *(int *)&in_RDI[1]._M_dataplus._M_p = iVar1;
  iVar1 = std::numeric_limits<int>::max();
  *(int *)((long)&in_RDI[1]._M_dataplus._M_p + 4) = iVar1;
  *(undefined4 *)&in_RDI[1]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[1]._M_string_length + 4) = 10000;
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  __t = (basic_string_view<char,_std::char_traits<char>_> *)0xbff0000000000000;
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffff70,
             (double)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_RDI,__t,in_stack_ffffffffffffffa0);
  std::allocator<char>::~allocator(&local_21);
  std::__cxx11::string::string(in_stack_ffffffffffffff80);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &in_RDI[5]._M_string_length;
  std::__cxx11::string::string(this_01);
  std::thread::thread((thread *)0x52a933);
  uVar2 = 0;
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff70,
             SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
  in_RDI[6].field_2._M_local_buf[1] = '\0';
  in_RDI[6].field_2._M_local_buf[2] = '\0';
  in_RDI[6].field_2._M_local_buf[3] = '\0';
  in_RDI[6].field_2._M_local_buf[4] = '\0';
  in_RDI[6].field_2._M_local_buf[5] = '\0';
  in_RDI[6].field_2._M_local_buf[6] = '\0';
  in_RDI[6].field_2._M_local_buf[7] = '\0';
  in_RDI[6].field_2._M_local_buf[8] = '\0';
  std::atomic<bool>::atomic
            ((atomic<bool> *)in_stack_ffffffffffffff70,
             SUB41((uint)in_stack_ffffffffffffff6c >> 0x18,0));
  in_RDI[6].field_2._M_local_buf[10] = '\0';
  in_RDI[6].field_2._M_local_buf[0xb] = local_19 & 1;
  in_RDI[6].field_2._M_local_buf[0xc] = '\0';
  CLI::std::atomic<unsigned_long>::atomic
            ((atomic<unsigned_long> *)in_stack_ffffffffffffff70,
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  std::unique_ptr<helics::BaseTimeCoordinator,std::default_delete<helics::BaseTimeCoordinator>>::
  unique_ptr<std::default_delete<helics::BaseTimeCoordinator>,void>(in_stack_ffffffffffffff70);
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  BlockingPriorityQueue
            ((BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff90));
  this_00 = (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             *)(&in_RDI[0xf].field_2._M_allocated_capacity + 1);
  CLI::std::make_shared<helics::LogManager>();
  *(undefined1 *)&in_RDI[0x10]._M_string_length = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 3) = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 4) = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 5) = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 6) = 0;
  *(undefined1 *)((long)&in_RDI[0x10]._M_string_length + 7) = 0;
  in_RDI[0x10].field_2._M_local_buf[0] = '\0';
  in_RDI[0x10].field_2._M_local_buf[1] = '\x01';
  in_RDI[0x10].field_2._M_local_buf[2] = '\0';
  in_RDI[0x10].field_2._M_local_buf[3] = '\0';
  CLI::std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(this_00);
  CLI::std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(this_00);
  std::atomic<int>::atomic((atomic<int> *)this_00,in_stack_ffffffffffffff6c);
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  in_RDI[0x13].field_2._M_local_buf[0] = '\0';
  CLI::std::shared_ptr<helics::ProfilerBuffer>::shared_ptr
            ((shared_ptr<helics::ProfilerBuffer> *)0x52aad6);
  *(undefined1 *)&in_RDI[0x14]._M_string_length = 0;
  *(undefined4 *)((long)&in_RDI[0x14]._M_string_length + 4) = 0;
  CLI::std::atomic<helics::BrokerBase::BrokerState>::atomic
            ((atomic<helics::BrokerBase::BrokerState> *)&in_RDI[0x14].field_2,CREATED);
  return;
}

Assistant:

BrokerBase::BrokerBase(std::string_view broker_name, bool DisableQueue):
    identifier(broker_name), queueDisabled(DisableQueue),
    mLogManager(std::make_shared<LogManager>())
{
}